

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzerResults.cpp
# Opt level: O0

void __thiscall
JtagAnalyzerResults::JtagAnalyzerResults
          (JtagAnalyzerResults *this,JtagAnalyzer *analyzer,JtagAnalyzerSettings *settings)

{
  JtagAnalyzerSettings *settings_local;
  JtagAnalyzer *analyzer_local;
  JtagAnalyzerResults *this_local;
  
  AnalyzerResults::AnalyzerResults(&this->super_AnalyzerResults);
  *(undefined ***)this = &PTR__JtagAnalyzerResults_00121cf8;
  this->mSettings = settings;
  this->mAnalyzer = analyzer;
  std::set<JtagShiftedData,_std::less<JtagShiftedData>,_std::allocator<JtagShiftedData>_>::set
            (&this->mShiftedData);
  return;
}

Assistant:

JtagAnalyzerResults::JtagAnalyzerResults( JtagAnalyzer* analyzer, JtagAnalyzerSettings* settings )
    : mSettings( settings ), mAnalyzer( analyzer )
{
}